

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_argv.c
# Opt level: O1

ssize_t mpt_message_argv(mpt_message *msg,int sep)

{
  iovec *piVar1;
  size_t sVar2;
  ssize_t sVar3;
  ulong uVar4;
  ushort **ppuVar5;
  iovec *piVar6;
  iovec local_30;
  
  local_30.iov_base = msg->base;
  local_30.iov_len = msg->used;
  if (local_30.iov_len == 0) {
    sVar2 = msg->clen;
    do {
      sVar2 = sVar2 - 1;
      if (sVar2 == 0xffffffffffffffff) {
        return -0x10;
      }
      piVar6 = msg->cont;
      local_30.iov_base = piVar6->iov_base;
      msg->base = local_30.iov_base;
      local_30.iov_len = piVar6->iov_len;
      msg->used = local_30.iov_len;
      msg->cont = piVar6 + 1;
      msg->clen = sVar2;
    } while (local_30.iov_len == 0);
  }
  piVar6 = msg->cont;
  sVar2 = msg->clen;
  if (sep == 0) {
    sep = 0;
  }
  else {
    sVar3 = mpt_memfcn(&local_30,1,notSpace,(void *)0x0);
    if (sVar3 < 0) {
      uVar4 = mpt_memfcn(piVar6,sVar2,notSpace,(void *)0x0);
      if (-1 < (long)uVar4) {
        local_30.iov_len = piVar6->iov_len;
        while (local_30.iov_len < uVar4) {
          uVar4 = uVar4 - local_30.iov_len;
          sVar2 = sVar2 - 1;
          piVar1 = piVar6 + 1;
          piVar6 = piVar6 + 1;
          local_30.iov_len = piVar1->iov_len;
        }
        local_30.iov_len = local_30.iov_len - uVar4;
        local_30.iov_base = (void *)(uVar4 + (long)piVar6->iov_base);
        msg->base = local_30.iov_base;
        msg->used = local_30.iov_len;
        msg->cont = piVar6;
        msg->clen = sVar2;
      }
    }
    else {
      local_30.iov_base = (void *)((long)local_30.iov_base + sVar3);
      msg->base = local_30.iov_base;
      local_30.iov_len = local_30.iov_len - sVar3;
      msg->used = local_30.iov_len;
    }
    ppuVar5 = __ctype_b_loc();
    if (-1 < (short)(*ppuVar5)[sep]) {
      sep = 0;
      sVar3 = mpt_memtok(&local_30,1,"\t \n\r\v",(char *)0x0,"\'\"");
      if (-1 < sVar3) {
        return sVar3;
      }
      if (sVar2 != 0) {
        sep = 0;
        sVar3 = mpt_memtok(piVar6,sVar2,"\t \n\r\v",(char *)0x0,"\'\"");
        if (-1 < sVar3) {
          return sVar3 + local_30.iov_len;
        }
      }
    }
  }
  sVar3 = nextChar(&local_30,piVar6,sVar2,sep);
  return sVar3;
}

Assistant:

extern ssize_t mpt_message_argv(MPT_STRUCT(message) *msg, int sep)
{
	struct iovec *cont;
	struct iovec curr;
	ssize_t part;
	size_t  clen;
	
	/* start on base data */
	curr.iov_base = (void *) msg->base;
	while (!(curr.iov_len = msg->used)) {
		if (!msg->clen) {
			return MPT_ERROR(MissingData);
		}
		curr.iov_base = (void *) (msg->base = msg->cont->iov_base);
		curr.iov_len = msg->used = msg->cont->iov_len;
		++msg->cont;
		--msg->clen;
	}
	cont = msg->cont;
	clen = msg->clen;
	
	/* find null character valid memory */
	if (!sep) {
		return nextChar(&curr, cont, clen, sep);
	}
	/* trim leading whitespace */
	if ((part = mpt_memfcn(&curr, 1, notSpace, 0)) >= 0) {
		msg->base = curr.iov_base = ((uint8_t *) curr.iov_base) + part;
		msg->used = curr.iov_len -= part;
	}
	else if ((part = mpt_memfcn(cont, clen, notSpace, 0)) >= 0) {
		while ((size_t) part > cont->iov_len) {
			part -= cont->iov_len;
			--clen;
			++cont;
		}
		msg->base = curr.iov_base = ((uint8_t *) cont->iov_base) + part;
		msg->used = curr.iov_len  = cont->iov_len - part;
		msg->cont = cont;
		msg->clen = clen;
	}
	/* find space character not in escapes */
	if (!isgraph(sep)) {
		if ((part = mpt_memtok(&curr, 1, "\t \n\r\v", NULL, "'\"")) >= 0) {
			return part;
		}
		if (clen && (part = mpt_memtok(cont, clen, "\t \n\r\v", NULL, "'\"")) >= 0) {
			return curr.iov_len + part;
		}
		sep = 0;
	}
	/* check for termination */
	return nextChar(&curr, cont, clen, sep);
}